

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

IterateResult __thiscall gl4cts::ShaderSubroutine::NegativeTest1::iterate(NegativeTest1 *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  ContextInfo *this_00;
  NotSupportedError *this_01;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  MessageBuilder local_fb8;
  uint local_e34;
  uint local_e30;
  GLenum shader_stage;
  uint n_undefined_shader_stage;
  uint n_undefined_shader_stages;
  GLenum undefined_shader_stages [4];
  MessageBuilder local_e10;
  undefined4 local_c8c;
  undefined1 local_c88 [4];
  GLuint temp_value;
  GLuint local_b08 [2];
  GLuint valid_subroutine_locations [2];
  GLuint local_980;
  GLuint local_97c;
  GLuint invalid_subroutine_indices2 [2];
  GLint local_7f8;
  GLint local_7f4;
  GLuint invalid_subroutine_indices [4];
  undefined4 local_664;
  undefined1 local_660 [4];
  GLuint index;
  MessageBuilder local_4e0;
  MessageBuilder local_360;
  undefined4 local_1e0;
  undefined4 local_1dc;
  GLint temp_values;
  GLint temp_length;
  undefined1 local_55;
  allocator<char> local_41;
  string local_40;
  long local_20;
  Functions *gl;
  NegativeTest1 *pNStack_10;
  GLenum error_code;
  NegativeTest1 *this_local;
  
  gl._4_4_ = 0;
  pNStack_10 = this;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  local_20 = CONCAT44(extraout_var,iVar2);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_shader_subroutine");
  if (!bVar1) {
    local_55 = 1;
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"GL_ARB_shader_subroutine is not supported.",&local_41);
    tcu::NotSupportedError::NotSupportedError(this_01,&local_40);
    local_55 = 0;
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  initTest(this);
  (**(code **)(local_20 + 0xa90))(this->m_po_not_linked_id,0x8b30,"subroutine_uniform_name");
  gl._4_4_ = (**(code **)(local_20 + 0x800))();
  if (gl._4_4_ != 0x502) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&temp_values,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)&temp_values,
                        (char (*) [128])
                        "glGetSubroutineUniformLocation() does not generate GL_INVALID_OPERATION error code when called for a non-linked program object."
                       );
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&temp_values);
    this->m_has_test_passed = false;
  }
  local_1dc = 0;
  local_1e0 = 0;
  (**(code **)(local_20 + 0x748))
            (this->m_po_id,0x8b31,this->m_po_active_subroutine_uniforms,0x8e4a,&local_1e0);
  gl._4_4_ = (**(code **)(local_20 + 0x800))();
  if (gl._4_4_ == 0x501) {
    (**(code **)(local_20 + 0x748))
              (this->m_po_id,0x8b31,this->m_po_active_subroutine_uniforms + 1,0x8e4a,&local_1e0);
    gl._4_4_ = (**(code **)(local_20 + 0x800))();
  }
  if (gl._4_4_ != 0x501) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_360,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_360,
                        (char (*) [174])
                        "glGetActiveSubroutineUniformiv() does not generate GL_INVALID_VALUE when passed <index> argument that is greater than or equal to the value of GL_ACTIVE_SUBROUTINE_UNIFORMS."
                       );
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_360);
    this->m_has_test_passed = false;
  }
  (**(code **)(local_20 + 0x740))
            (this->m_po_id,0x8b31,this->m_po_active_subroutine_uniforms,0,&local_1dc,0);
  gl._4_4_ = (**(code **)(local_20 + 0x800))();
  if (gl._4_4_ == 0x501) {
    (**(code **)(local_20 + 0x740))
              (this->m_po_id,0x8b31,this->m_po_active_subroutine_uniforms + 1,0,&local_1dc,0);
    gl._4_4_ = (**(code **)(local_20 + 0x800))();
  }
  if (gl._4_4_ != 0x501) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_4e0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_4e0,
                        (char (*) [176])
                        "glGetActiveSubroutineUniformName() does not generate GL_INVALID_VALUE when passed <index> argument that is greater than or equal to the value of GL_ACTIVE_SUBROUTINE_UNIFORMS."
                       );
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4e0);
    this->m_has_test_passed = false;
  }
  (**(code **)(local_20 + 0x738))(this->m_po_id,0x8b31,this->m_po_active_subroutines,0,&local_1dc,0)
  ;
  gl._4_4_ = (**(code **)(local_20 + 0x800))();
  if (gl._4_4_ == 0x501) {
    (**(code **)(local_20 + 0x738))
              (this->m_po_id,0x8b31,this->m_po_active_subroutines + 1,0,&local_1dc,0);
    gl._4_4_ = (**(code **)(local_20 + 0x800))();
  }
  if (gl._4_4_ != 0x501) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)local_660,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_660,
                        (char (*) [161])
                        "glGetActiveSubroutineName() does not generate GL_INVALID_VALUE when passed <index> argument that is greater than or equal to the value of GL_ACTIVE_SUBROUTINES."
                       );
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_660);
    this->m_has_test_passed = false;
  }
  local_664 = 0;
  (**(code **)(local_20 + 0x1680))(this->m_po_id);
  dVar3 = (**(code **)(local_20 + 0x800))();
  glu::checkError(dVar3,"glUseProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x2a79);
  (**(code **)(local_20 + 0x1668))
            (0x8b31,this->m_po_active_subroutine_uniform_locations + -1,&local_664);
  gl._4_4_ = (**(code **)(local_20 + 0x800))();
  if (gl._4_4_ == 0x501) {
    (**(code **)(local_20 + 0x1668))
              (0x8b31,this->m_po_active_subroutine_uniform_locations + 1,&local_664);
    gl._4_4_ = (**(code **)(local_20 + 0x800))();
  }
  if (gl._4_4_ != 0x501) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)(invalid_subroutine_indices + 2),pTVar5,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)(invalid_subroutine_indices + 2),
                        (char (*) [163])
                        "glUniformSubroutinesiv() does not generate GL_INVALID_VALUE when passed <count> argument that is not equal to the value of GL_ACTIVE_SUBROUTINE_UNIFORM_LOCATIONS."
                       );
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)(invalid_subroutine_indices + 2));
    this->m_has_test_passed = false;
  }
  local_7f8 = this->m_po_active_subroutines;
  local_7f4 = this->m_po_active_subroutines;
  invalid_subroutine_indices[0] = this->m_po_active_subroutines + 1;
  invalid_subroutine_indices[1] = this->m_po_active_subroutines + 1;
  (**(code **)(local_20 + 0x1668))(0x8b31,this->m_po_active_subroutine_uniform_locations,&local_7f8)
  ;
  gl._4_4_ = (**(code **)(local_20 + 0x800))();
  if (gl._4_4_ == 0x501) {
    (**(code **)(local_20 + 0x1668))
              (0x8b31,this->m_po_active_subroutine_uniform_locations,invalid_subroutine_indices);
    gl._4_4_ = (**(code **)(local_20 + 0x800))();
  }
  if (gl._4_4_ != 0x501) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)invalid_subroutine_indices2,pTVar5,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)invalid_subroutine_indices2,
                        (char (*) [170])
                        "glUniformSubroutinesuiv() does not generate GL_INVALID_VALUE when the value passed via <indices> argument is greater than or equal to the value of GL_ACTIVE_SUBROUTINES."
                       );
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)invalid_subroutine_indices2);
    this->m_has_test_passed = false;
  }
  local_980 = this->m_po_subroutine_test1_index;
  local_97c = this->m_po_subroutine_test1_index;
  (**(code **)(local_20 + 0x1668))(0x8b31,this->m_po_active_subroutine_uniform_locations,&local_980)
  ;
  gl._4_4_ = (**(code **)(local_20 + 0x800))();
  if (gl._4_4_ != 0x502) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)valid_subroutine_locations,pTVar5,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)valid_subroutine_locations,
                        (char (*) [239])
                        "glUniformSubroutinesuiv() does not generate GL_INVALID_OPERATION when the subroutine index passed via <indices> argument identifiesa subroutine not associated with the type of the subroutine uniform assigned to the corresponding location."
                       );
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)valid_subroutine_locations);
    this->m_has_test_passed = false;
  }
  memset(local_b08,0,8);
  valid_subroutine_locations[(long)this->m_po_subroutine_uniform_function_index + -2] =
       this->m_po_subroutine_test1_index;
  valid_subroutine_locations[(long)this->m_po_subroutine_uniform_function2_index + -2] =
       this->m_po_subroutine_test3_index;
  (**(code **)(local_20 + 0x1680))(0);
  dVar3 = (**(code **)(local_20 + 0x800))();
  glu::checkError(dVar3,"glUseProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x2acc);
  (**(code **)(local_20 + 0x1668))(0x8b31,this->m_po_active_subroutine_uniform_locations,local_b08);
  gl._4_4_ = (**(code **)(local_20 + 0x800))();
  if (gl._4_4_ != 0x502) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)local_c88,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_c88,
                        (char (*) [111])
                        "glUniformSubroutinesuiv() does not generate GL_INVALID_OPERATION when called without an active program object."
                       );
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_c88);
    this->m_has_test_passed = false;
  }
  local_c8c = 0;
  (**(code **)(local_20 + 0x1680))(this->m_po_id);
  dVar3 = (**(code **)(local_20 + 0x800))();
  glu::checkError(dVar3,"glUseProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x2ae2);
  (**(code **)(local_20 + 0xb50))(0x8b31,this->m_po_active_subroutine_uniform_locations,&local_c8c);
  gl._4_4_ = (**(code **)(local_20 + 0x800))();
  if (gl._4_4_ == 0x501) {
    (**(code **)(local_20 + 0xb50))
              (0x8b31,this->m_po_active_subroutine_uniform_locations + 1,&local_c8c);
    gl._4_4_ = (**(code **)(local_20 + 0x800))();
  }
  if (gl._4_4_ != 0x501) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_e10,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_e10,
                        (char (*) [174])
                        "glGetUniformSubroutineuiv() does not generate GL_INVALID_VALUE when called for location that is greater than or equal to the value of GL_ACTIVE_SUBROUTINE_UNIFORM_LOCATIONS."
                       );
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_e10);
    this->m_has_test_passed = false;
  }
  _n_undefined_shader_stage = 0x8dd900008b30;
  undefined_shader_stages[0] = 0x8e88;
  undefined_shader_stages[1] = 0x8e87;
  shader_stage = 4;
  for (local_e30 = 0; local_e30 < 4; local_e30 = local_e30 + 1) {
    local_e34 = (&n_undefined_shader_stage)[local_e30];
    (**(code **)(local_20 + 0xb50))(local_e34,0,&local_c8c);
    gl._4_4_ = (**(code **)(local_20 + 0x800))();
    if (gl._4_4_ != 0x502) {
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_fb8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (&local_fb8,
                          (char (*) [145])
                          "glGetUniformSubroutineuiv() does not generate GL_INVALID_OPERATION when called for a shader stage that is not defined for active program object."
                         );
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_fb8);
      this->m_has_test_passed = false;
    }
  }
  if ((this->m_has_test_passed & 1U) == 0) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Fail");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult NegativeTest1::iterate()
{
	glw::GLenum			  error_code = GL_NO_ERROR;
	const glw::Functions& gl		 = m_context.getRenderContext().getFunctions();

	/* Do not execute the test if GL_ARB_shader_subroutine is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_subroutine"))
	{
		throw tcu::NotSupportedError("GL_ARB_shader_subroutine is not supported.");
	}

	/* Initialize GL objects required to run the test */
	initTest();

	/* The error INVALID_OPERATION is generated by GetSubroutineUniformLocation
	 * if the program object identified by <program> has not been successfully
	 * linked.
	 */
	gl.getSubroutineUniformLocation(m_po_not_linked_id, GL_FRAGMENT_SHADER, "subroutine_uniform_name");

	error_code = gl.getError();

	if (error_code != GL_INVALID_OPERATION)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "glGetSubroutineUniformLocation() does not generate GL_INVALID_OPERATION "
							  "error code when called for a non-linked program object."
						   << tcu::TestLog::EndMessage;

		m_has_test_passed = false;
	}

	/* The error INVALID_VALUE is generated by GetActiveSubroutineUniformiv or
	 * GetActiveSubroutineUniformName if <index> is greater than or equal to the
	 * value of ACTIVE_SUBROUTINE_UNIFORMS for the shader stage.
	 */
	glw::GLint temp_length = 0;
	glw::GLint temp_values = 0;

	gl.getActiveSubroutineUniformiv(m_po_id, GL_VERTEX_SHADER, m_po_active_subroutine_uniforms,
									GL_NUM_COMPATIBLE_SUBROUTINES, &temp_values);
	error_code = gl.getError();

	if (error_code == GL_INVALID_VALUE)
	{
		gl.getActiveSubroutineUniformiv(m_po_id, GL_VERTEX_SHADER, m_po_active_subroutine_uniforms + 1,
										GL_NUM_COMPATIBLE_SUBROUTINES, &temp_values);

		error_code = gl.getError();
	}

	if (error_code != GL_INVALID_VALUE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "glGetActiveSubroutineUniformiv() does not generate GL_INVALID_VALUE "
							  "when passed <index> argument that is greater than or equal to "
							  "the value of GL_ACTIVE_SUBROUTINE_UNIFORMS."
						   << tcu::TestLog::EndMessage;

		m_has_test_passed = false;
	}

	gl.getActiveSubroutineUniformName(m_po_id, GL_VERTEX_SHADER, m_po_active_subroutine_uniforms, 0, /* bufsize */
									  &temp_length, DE_NULL);										 /* name */
	error_code = gl.getError();

	if (error_code == GL_INVALID_VALUE)
	{
		gl.getActiveSubroutineUniformName(m_po_id, GL_VERTEX_SHADER, m_po_active_subroutine_uniforms + 1,
										  0,					  /* bufsize */
										  &temp_length, DE_NULL); /* name */

		error_code = gl.getError();
	}

	if (error_code != GL_INVALID_VALUE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "glGetActiveSubroutineUniformName() does not generate GL_INVALID_VALUE "
							  "when passed <index> argument that is greater than or equal to "
							  "the value of GL_ACTIVE_SUBROUTINE_UNIFORMS."
						   << tcu::TestLog::EndMessage;

		m_has_test_passed = false;
	}

	/* The error INVALID_VALUE is generated by GetActiveSubroutineName if <index>
	 * is greater than or equal to the value of ACTIVE_SUBROUTINES for the shader
	 * stage.
	 */
	gl.getActiveSubroutineName(m_po_id, GL_VERTEX_SHADER, m_po_active_subroutines, 0, /* bufsize */
							   &temp_length, DE_NULL);								  /* name */
	error_code = gl.getError();

	if (error_code == GL_INVALID_VALUE)
	{
		gl.getActiveSubroutineName(m_po_id, GL_VERTEX_SHADER, m_po_active_subroutines + 1, 0, /* bufsize */
								   &temp_length, DE_NULL);									  /* name */

		error_code = gl.getError();
	}

	if (error_code != GL_INVALID_VALUE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "glGetActiveSubroutineName() does not generate GL_INVALID_VALUE "
													   "when passed <index> argument that is greater than or equal to "
													   "the value of GL_ACTIVE_SUBROUTINES."
						   << tcu::TestLog::EndMessage;

		m_has_test_passed = false;
	}

	/* The error INVALID_VALUE is generated by UniformSubroutinesuiv if <count>
	 * is not equal to the value of ACTIVE_SUBROUTINE_UNIFORM_LOCATIONS for the
	 * shader stage <shadertype>.
	 */
	glw::GLuint index = 0;

	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

	gl.uniformSubroutinesuiv(GL_VERTEX_SHADER, m_po_active_subroutine_uniform_locations - 1, &index);
	error_code = gl.getError();

	if (error_code == GL_INVALID_VALUE)
	{
		gl.uniformSubroutinesuiv(GL_VERTEX_SHADER, m_po_active_subroutine_uniform_locations + 1, &index);

		error_code = gl.getError();
	}

	if (error_code != GL_INVALID_VALUE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "glUniformSubroutinesiv() does not generate GL_INVALID_VALUE "
													   "when passed <count> argument that is not equal to the value of "
													   "GL_ACTIVE_SUBROUTINE_UNIFORM_LOCATIONS."
						   << tcu::TestLog::EndMessage;

		m_has_test_passed = false;
	}

	/* The error INVALID_VALUE is generated by UniformSubroutinesuiv if any value
	 * in <indices> is greater than or equal to the value of ACTIVE_SUBROUTINES
	 * for the shader stage.
	 */
	glw::GLuint invalid_subroutine_indices[4] = { (GLuint)m_po_active_subroutines, (GLuint)m_po_active_subroutines,
												  (GLuint)m_po_active_subroutines + 1,
												  (GLuint)m_po_active_subroutines + 1 };

	gl.uniformSubroutinesuiv(GL_VERTEX_SHADER, m_po_active_subroutine_uniform_locations, /* count */
							 invalid_subroutine_indices + 0);
	error_code = gl.getError();

	if (error_code == GL_INVALID_VALUE)
	{
		gl.uniformSubroutinesuiv(GL_VERTEX_SHADER, m_po_active_subroutine_uniform_locations,
								 invalid_subroutine_indices + 2);

		error_code = gl.getError();
	}

	if (error_code != GL_INVALID_VALUE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "glUniformSubroutinesuiv() does not generate GL_INVALID_VALUE "
													   "when the value passed via <indices> argument is greater than "
													   "or equal to the value of GL_ACTIVE_SUBROUTINES."
						   << tcu::TestLog::EndMessage;

		m_has_test_passed = false;
	}

	/* The error INVALID_OPERATION is generated by UniformSubroutinesuiv() if any
	 * subroutine index in <indices> identifies a subroutine not associated with
	 * the type of the subroutine uniform variable assigned to the corresponding
	 * location.
	 */
	glw::GLuint invalid_subroutine_indices2[2] = { m_po_subroutine_test1_index, m_po_subroutine_test1_index };

	gl.uniformSubroutinesuiv(GL_VERTEX_SHADER, m_po_active_subroutine_uniform_locations, invalid_subroutine_indices2);
	error_code = gl.getError();

	if (error_code != GL_INVALID_OPERATION)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "glUniformSubroutinesuiv() does not generate GL_INVALID_OPERATION "
							  "when the subroutine index passed via <indices> argument identifies"
							  "a subroutine not associated with the type of the subroutine uniform "
							  "assigned to the corresponding location."
						   << tcu::TestLog::EndMessage;

		m_has_test_passed = false;
	}

	/* The error INVALID_OPERATION is generated by UniformSubroutinesuiv if no
	 * program is active.
	 */
	glw::GLuint valid_subroutine_locations[2] = { 0 };

	valid_subroutine_locations[m_po_subroutine_uniform_function_index]  = m_po_subroutine_test1_index;
	valid_subroutine_locations[m_po_subroutine_uniform_function2_index] = m_po_subroutine_test3_index;

	gl.useProgram(0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

	gl.uniformSubroutinesuiv(GL_VERTEX_SHADER, m_po_active_subroutine_uniform_locations, valid_subroutine_locations);
	error_code = gl.getError();

	if (error_code != GL_INVALID_OPERATION)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "glUniformSubroutinesuiv() does not generate GL_INVALID_OPERATION "
							  "when called without an active program object."
						   << tcu::TestLog::EndMessage;

		m_has_test_passed = false;
	}

	/* The error INVALID_VALUE is generated by GetUniformSubroutineuiv if
	 * <location> is greater than or equal to the value of
	 * ACTIVE_SUBROUTINE_UNIFORM_LOCATIONS for the shader stage.
	 */
	glw::GLuint temp_value = 0;

	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

	gl.getUniformSubroutineuiv(GL_VERTEX_SHADER, m_po_active_subroutine_uniform_locations, &temp_value);
	error_code = gl.getError();

	if (error_code == GL_INVALID_VALUE)
	{
		gl.getUniformSubroutineuiv(GL_VERTEX_SHADER, m_po_active_subroutine_uniform_locations + 1, &temp_value);
		error_code = gl.getError();
	}

	if (error_code != GL_INVALID_VALUE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "glGetUniformSubroutineuiv() does not generate GL_INVALID_VALUE "
							  "when called for location that is greater than or equal to the value "
							  "of GL_ACTIVE_SUBROUTINE_UNIFORM_LOCATIONS."
						   << tcu::TestLog::EndMessage;

		m_has_test_passed = false;
	}

	/* The error INVALID_OPERATION is generated by GetUniformSubroutineuiv if no
	 * program is active for the shader stage identified by <shadertype>.
	 */
	const glw::GLenum undefined_shader_stages[] = { GL_FRAGMENT_SHADER, GL_GEOMETRY_SHADER, GL_TESS_CONTROL_SHADER,
													GL_TESS_EVALUATION_SHADER };
	const unsigned int n_undefined_shader_stages = sizeof(undefined_shader_stages) / sizeof(undefined_shader_stages[0]);

	for (unsigned int n_undefined_shader_stage = 0; n_undefined_shader_stage < n_undefined_shader_stages;
		 ++n_undefined_shader_stage)
	{
		glw::GLenum shader_stage = undefined_shader_stages[n_undefined_shader_stage];

		gl.getUniformSubroutineuiv(shader_stage, 0, /* location */
								   &temp_value);
		error_code = gl.getError();

		if (error_code != GL_INVALID_OPERATION)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "glGetUniformSubroutineuiv() does not generate GL_INVALID_OPERATION "
								  "when called for a shader stage that is not defined for active "
								  "program object."
							   << tcu::TestLog::EndMessage;

			m_has_test_passed = false;
		}
	} /* for (all undefined shader stages) */

	/* All done */
	if (m_has_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}